

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>::fastAccessDx
          (FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_> *this,
          int i)

{
  return ((((this->left_->fadexpr_).left_)->dx_).ptr_to_data[i] +
         (((this->left_->fadexpr_).right_)->dx_).ptr_to_data[i]) * (this->right_).constant_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val();}